

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Int64 __thiscall Json::Value::asInt64(Value *this)

{
  bool bVar1;
  ValueType VVar2;
  String local_4f0;
  ostringstream local_4d0 [8];
  OStringStream oss_2;
  String local_358;
  ostringstream local_338 [8];
  OStringStream oss_1;
  String local_1c0;
  ostringstream local_190 [8];
  OStringStream oss;
  Value *this_local;
  
  VVar2 = type(this);
  switch(VVar2) {
  case nullValue:
    this_local = (Value *)0x0;
    break;
  case intValue:
    this_local = (Value *)(this->value_).map_;
    break;
  case uintValue:
    bVar1 = isInt64(this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"LargestUInt out of Int64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_1c0);
    }
    this_local = (Value *)(this->value_).map_;
    break;
  case realValue:
    bVar1 = InRange<long,long>((this->value_).real_,-0x8000000000000000,0x7fffffffffffffff);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_338);
      std::operator<<((ostream *)local_338,"double out of Int64 range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_358);
    }
    this_local = (Value *)(long)(this->value_).real_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_4d0);
    std::operator<<((ostream *)local_4d0,"Value is not convertible to Int64.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_4f0);
  case booleanValue:
    this_local = (Value *)(long)(int)(uint)(((this->value_).bool_ & 1U) != 0);
  }
  return (Int64)this_local;
}

Assistant:

Value::Int64 Value::asInt64() const {
  switch (type()) {
  case intValue:
    return Int64(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt64(), "LargestUInt out of Int64 range");
    return Int64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt64, maxInt64),
                        "double out of Int64 range");
    return Int64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int64.");
}